

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::__cxx11::string>::internalSetData<std::__cxx11::string>
          (Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  byte bVar1;
  string *in_RSI;
  long in_RDI;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  RepType *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  string local_58 [39];
  byte local_31;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_58,in_RSI);
  bVar1 = ParameterTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::convert((RepType *)
                    CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                    in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_58);
  local_31 = bVar1 & 1;
  if (local_31 != 0) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_30);
  }
  std::__cxx11::string::~string(local_30);
  return (bool)(local_31 & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }